

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_strings.hpp
# Opt level: O0

void __thiscall
pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)4>
          (string_mapping *this,_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *db)

{
  element_type *this_00;
  size_t __n;
  undefined1 local_30 [8];
  shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  index;
  database *db_local;
  string_mapping *this_local;
  
  index.
  super___shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = db;
  std::
  unordered_map<pstore::address,_unsigned_long,_std::hash<pstore::address>,_std::equal_to<pstore::address>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>_>
  ::unordered_map(&this->strings_);
  pstore::index::
  get_index<(pstore::trailer::indices)4,pstore::database_const,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>const>
            ((index *)local_30,
             (database *)
             index.
             super___shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi,true);
  this_00 = std::
            __shared_ptr_access<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_30);
  __n = pstore::index::
        hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
        ::size(this_00);
  std::
  unordered_map<pstore::address,_unsigned_long,_std::hash<pstore::address>,_std::equal_to<pstore::address>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>_>
  ::reserve(&this->strings_,__n);
  std::
  shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  ::~shared_ptr((shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
                 *)local_30);
  return;
}

Assistant:

string_mapping (database const & db, index_tag<Index>) {
                    auto const index = index::get_index<Index> (db);
                    strings_.reserve (index->size ());
                }